

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feed.c
# Opt level: O0

int equal_feeds(feed_t *a,feed_t *b)

{
  int iVar1;
  int local_5c;
  int local_58;
  int i_14;
  int i_13;
  int i_12;
  int i_11;
  int i_10;
  int i_9;
  int i_8;
  int i_7;
  int i_6;
  int i_5;
  int i_4;
  int i_3;
  int i_2;
  int i_1;
  int i;
  feed_t *b_local;
  feed_t *a_local;
  
  if (a->agency_count == b->agency_count) {
    if (a->calendar_dates_count == b->calendar_dates_count) {
      if (a->calendar_records_count == b->calendar_records_count) {
        if (a->fare_attributes_count == b->fare_attributes_count) {
          if (a->fare_rules_count == b->fare_rules_count) {
            if (a->feed_info_count == b->feed_info_count) {
              if (a->frequencies_count == b->frequencies_count) {
                if (a->levels_count == b->levels_count) {
                  if (a->pathways_count == b->pathways_count) {
                    if (a->routes_count == b->routes_count) {
                      if (a->shapes_count == b->shapes_count) {
                        if (a->stop_times_count == b->stop_times_count) {
                          if (a->stops_count == b->stops_count) {
                            if (a->transfers_count == b->transfers_count) {
                              if (a->trips_count == b->trips_count) {
                                for (i_2 = 0; i_2 < a->agency_count; i_2 = i_2 + 1) {
                                  iVar1 = equal_agency(a->agencies + i_2,b->agencies + i_2);
                                  if (iVar1 == 0) {
                                    return 0;
                                  }
                                }
                                for (i_3 = 0; i_3 < a->calendar_dates_count; i_3 = i_3 + 1) {
                                  iVar1 = equal_calendar_date(a->calendar_dates + i_3,
                                                              b->calendar_dates + i_3);
                                  if (iVar1 == 0) {
                                    return 0;
                                  }
                                }
                                for (i_4 = 0; i_4 < a->calendar_records_count; i_4 = i_4 + 1) {
                                  iVar1 = equal_calendar_record
                                                    (a->calendar_records + i_4,
                                                     b->calendar_records + i_4);
                                  if (iVar1 == 0) {
                                    return 0;
                                  }
                                }
                                for (i_5 = 0; i_5 < a->fare_attributes_count; i_5 = i_5 + 1) {
                                  iVar1 = equal_fare_attributes
                                                    (a->fare_attributes + i_5,
                                                     b->fare_attributes + i_5);
                                  if (iVar1 == 0) {
                                    return 0;
                                  }
                                }
                                for (i_6 = 0; i_6 < a->fare_rules_count; i_6 = i_6 + 1) {
                                  iVar1 = equal_fare_rule(a->fare_rules + i_6,b->fare_rules + i_6);
                                  if (iVar1 == 0) {
                                    return 0;
                                  }
                                }
                                for (i_7 = 0; i_7 < a->feed_info_count; i_7 = i_7 + 1) {
                                  iVar1 = equal_feed_info(a->feed_info + i_7,b->feed_info + i_7);
                                  if (iVar1 == 0) {
                                    return 0;
                                  }
                                }
                                for (i_8 = 0; i_8 < a->frequencies_count; i_8 = i_8 + 1) {
                                  iVar1 = equal_frequency(a->frequencies + i_8,b->frequencies + i_8)
                                  ;
                                  if (iVar1 == 0) {
                                    return 0;
                                  }
                                }
                                for (i_9 = 0; i_9 < a->levels_count; i_9 = i_9 + 1) {
                                  iVar1 = equal_level(a->levels + i_9,b->levels + i_9);
                                  if (iVar1 == 0) {
                                    return 0;
                                  }
                                }
                                for (i_10 = 0; i_10 < a->pathways_count; i_10 = i_10 + 1) {
                                  iVar1 = equal_pathway(a->pathways + i_10,b->pathways + i_10);
                                  if (iVar1 == 0) {
                                    return 0;
                                  }
                                }
                                for (i_11 = 0; i_11 < a->routes_count; i_11 = i_11 + 1) {
                                  iVar1 = equal_route(a->routes + i_11,b->routes + i_11);
                                  if (iVar1 == 0) {
                                    return 0;
                                  }
                                }
                                for (i_12 = 0; i_12 < a->shapes_count; i_12 = i_12 + 1) {
                                  iVar1 = equal_shape(a->shapes + i_12,b->shapes + i_12);
                                  if (iVar1 == 0) {
                                    return 0;
                                  }
                                }
                                for (i_13 = 0; i_13 < a->stop_times_count; i_13 = i_13 + 1) {
                                  iVar1 = equal_stop_time(a->stop_times + i_13,b->stop_times + i_13)
                                  ;
                                  if (iVar1 == 0) {
                                    return 0;
                                  }
                                }
                                for (i_14 = 0; i_14 < a->stops_count; i_14 = i_14 + 1) {
                                  iVar1 = equal_stop(a->stops + i_14,b->stops + i_14);
                                  if (iVar1 == 0) {
                                    return 0;
                                  }
                                }
                                for (local_58 = 0; local_58 < a->transfers_count;
                                    local_58 = local_58 + 1) {
                                  iVar1 = equal_transfer(a->transfers + local_58,
                                                         b->transfers + local_58);
                                  if (iVar1 == 0) {
                                    return 0;
                                  }
                                }
                                for (local_5c = 0; local_5c < a->trips_count;
                                    local_5c = local_5c + 1) {
                                  iVar1 = equal_trip(a->trips + local_5c,b->trips + local_5c);
                                  if (iVar1 == 0) {
                                    return 0;
                                  }
                                }
                                a_local._4_4_ = 1;
                              }
                              else {
                                a_local._4_4_ = 0;
                              }
                            }
                            else {
                              a_local._4_4_ = 0;
                            }
                          }
                          else {
                            a_local._4_4_ = 0;
                          }
                        }
                        else {
                          a_local._4_4_ = 0;
                        }
                      }
                      else {
                        a_local._4_4_ = 0;
                      }
                    }
                    else {
                      a_local._4_4_ = 0;
                    }
                  }
                  else {
                    a_local._4_4_ = 0;
                  }
                }
                else {
                  a_local._4_4_ = 0;
                }
              }
              else {
                a_local._4_4_ = 0;
              }
            }
            else {
              a_local._4_4_ = 0;
            }
          }
          else {
            a_local._4_4_ = 0;
          }
        }
        else {
          a_local._4_4_ = 0;
        }
      }
      else {
        a_local._4_4_ = 0;
      }
    }
    else {
      a_local._4_4_ = 0;
    }
  }
  else {
    a_local._4_4_ = 0;
  }
  return a_local._4_4_;
}

Assistant:

int equal_feeds(const feed_t *a, const feed_t *b) {
    if (a->agency_count != b->agency_count)
        return 0;

    if (a->calendar_dates_count != b->calendar_dates_count)
        return 0;

    if (a->calendar_records_count != b->calendar_records_count)
        return 0;

    if (a->fare_attributes_count != b->fare_attributes_count)
        return 0;

    if (a->fare_rules_count != b->fare_rules_count)
        return 0;

    if (a->feed_info_count != b->feed_info_count)
        return 0;

    if (a->frequencies_count != b->frequencies_count)
        return 0;

    if (a->levels_count != b->levels_count)
        return 0;

    if (a->pathways_count != b->pathways_count)
        return 0;

    if (a->routes_count != b->routes_count)
        return 0;

    if (a->shapes_count != b->shapes_count)
        return 0;

    if (a->stop_times_count != b->stop_times_count)
        return 0;

    if (a->stops_count != b->stops_count)
        return 0;

    if (a->transfers_count != b->transfers_count)
        return 0;

    if (a->trips_count != b->trips_count)
        return 0;


    for (int i = 0; i < a->agency_count; i++)
        if (!equal_agency(&(a->agencies[i]), &(b->agencies[i])))
            return 0;

    for (int i = 0; i < a->calendar_dates_count; i++)
        if (!equal_calendar_date(&(a->calendar_dates[i]), &(b->calendar_dates[i])))
            return 0;

    for (int i = 0; i < a->calendar_records_count; i++)
        if (!equal_calendar_record(&(a->calendar_records[i]), &(b->calendar_records[i])))
            return 0;

    for (int i = 0; i < a->fare_attributes_count; i++)
        if (!equal_fare_attributes(&(a->fare_attributes[i]), &(b->fare_attributes[i])))
            return 0;

    for (int i = 0; i < a->fare_rules_count; i++)
        if (!equal_fare_rule(&(a->fare_rules[i]), &(b->fare_rules[i])))
            return 0;

    for (int i = 0; i < a->feed_info_count; i++)
        if (!equal_feed_info(&(a->feed_info[i]), &(b->feed_info[i])))
            return 0;

    for (int i = 0; i < a->frequencies_count; i++)
        if (!equal_frequency(&(a->frequencies[i]), &(b->frequencies[i])))
            return 0;

    for (int i = 0; i < a->levels_count; i++)
        if (!equal_level(&(a->levels[i]), &(b->levels[i])))
            return 0;

    for (int i = 0; i < a->pathways_count; i++)
        if (!equal_pathway(&(a->pathways[i]), &(b->pathways[i])))
            return 0;

    for (int i = 0; i < a->routes_count; i++)
        if (!equal_route(&(a->routes[i]), &(b->routes[i])))
            return 0;

    for (int i = 0; i < a->shapes_count; i++)
        if (!equal_shape(&(a->shapes[i]), &(b->shapes[i])))
            return 0;

    for (int i = 0; i < a->stop_times_count; i++)
        if (!equal_stop_time(&(a->stop_times[i]), &(b->stop_times[i])))
            return 0;

    for (int i = 0; i < a->stops_count; i++)
        if (!equal_stop(&(a->stops[i]), &(b->stops[i])))
            return 0;

    for (int i = 0; i < a->transfers_count; i++)
        if (!equal_transfer(&(a->transfers[i]), &(b->transfers[i])))
            return 0;

    for (int i = 0; i < a->trips_count; i++)
        if (!equal_trip(&(a->trips[i]), &(b->trips[i])))
            return 0;

    return 1;
}